

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastInstancesIterator::
init<Kernel::TypedTermList>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  int *piVar1;
  BindingMap *this_00;
  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_01;
  int iVar2;
  TermSpec val;
  TermSpec val_00;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> local_30;
  
  val.t = query.super_TermList._content;
  this->_retrieveSubstitution = retrieveSubstitution;
  iVar2 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar2,0);
  if (SUB41(iVar2,0) == false) {
    ::Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::getEmpty();
  }
  else {
    (*root->_vptr_Node[8])(&local_30,root);
  }
  ::Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::operator=
            (&this->_ldIterator,&local_30);
  if (local_30._core != (IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x0) {
    piVar1 = &(local_30._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_30._core)->_vptr_IteratorCore[1])();
    }
  }
  this->_root = root;
  (this->_subst)._boundVars._cursor = (this->_subst)._boundVars._stack;
  this_00 = &(this->_subst)._bindings;
  ::Lib::
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::reset(this_00);
  this_01 = &(this->_subst)._derefBindings;
  ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (this_01);
  val._0_8_ = 1;
  ::Lib::
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::insert(this_00,(TermList)0x3,val);
  val_00.t._content = query._sort._content._content;
  val_00._0_8_ = 1;
  ::Lib::
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::insert(this_00,(TermList)0x7,val_00);
  if (this->_inLeaf == true) {
    ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (this_01);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }